

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O3

int loader_impl_dependencies(loader_impl impl)

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  undefined8 uVar9;
  long lVar10;
  
  lVar2 = configuration_value_type(impl->config,"dependencies",10);
  if (lVar2 != 0) {
    lVar3 = value_type_count(lVar2);
    lVar2 = value_to_map(lVar2);
    if (lVar3 != 0) {
      lVar10 = 0;
      do {
        iVar1 = value_type_id(*(undefined8 *)(lVar2 + lVar10 * 8));
        if (iVar1 == 9) {
          puVar4 = (undefined8 *)value_to_array(*(undefined8 *)(lVar2 + lVar10 * 8));
          iVar1 = value_type_id(puVar4[1]);
          if (iVar1 == 9) {
            lVar5 = value_to_array(puVar4[1]);
            lVar6 = value_type_count(puVar4[1]);
            while( true ) {
              if (lVar6 == 0) {
                iVar1 = value_type_id(*puVar4);
                if (iVar1 == 7) {
                  pcVar8 = (char *)value_to_string(*puVar4);
                }
                else {
                  pcVar8 = "unknown_library";
                }
                uVar9 = plugin_name(impl->p);
                log_write_impl_va("metacall",0x159,"loader_impl_dependencies",
                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                                  ,3,
                                  "Failed to load dependency \'%s\' from loader configuration \'%s.json\'"
                                  ,pcVar8,uVar9);
                return 1;
              }
              iVar1 = value_type_id(*(undefined8 *)(lVar5 + lVar10 * 8));
              if (((iVar1 == 7) &&
                  (lVar7 = value_to_string(*(undefined8 *)(lVar5 + lVar10 * 8)), lVar7 != 0)) &&
                 (lVar7 = dynlink_load_absolute(lVar7,10), lVar7 != 0)) break;
              lVar6 = lVar6 + -1;
            }
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != lVar3);
    }
  }
  return 0;
}

Assistant:

int loader_impl_dependencies(loader_impl impl)
{
	/* Dependencies have the following format */
	/*
	{
		"dependencies": {
			"node": ["/usr/lib/x86_64-linux-gnu/libnode.so.72"]
		}
	}
	*/
	value dependencies_value = configuration_value_type(impl->config, "dependencies", TYPE_MAP);

	if (dependencies_value != NULL)
	{
		size_t size = value_type_count(dependencies_value);
		value *dependencies_map = value_to_map(dependencies_value);
		size_t iterator;

		for (iterator = 0; iterator < size; ++iterator)
		{
			if (value_type_id(dependencies_map[iterator]) == TYPE_ARRAY)
			{
				value *library_tuple = value_to_array(dependencies_map[iterator]);

				if (value_type_id(library_tuple[1]) == TYPE_ARRAY)
				{
					value *paths_array = value_to_array(library_tuple[1]);
					size_t paths_size = value_type_count(library_tuple[1]);
					size_t path;
					int found = 0;

					for (path = 0; path < paths_size; ++path)
					{
						if (value_type_id(paths_array[iterator]) == TYPE_STRING)
						{
							const char *library_path = value_to_string(paths_array[iterator]);

							if (library_path != NULL)
							{
								dynlink handle = dynlink_load_absolute(library_path, DYNLINK_FLAGS_BIND_LAZY | DYNLINK_FLAGS_BIND_GLOBAL);

								if (handle != NULL)
								{
									found = 1;
									break;
								}
							}
						}
					}

					if (!found)
					{
						const char *dependency = value_type_id(library_tuple[0]) == TYPE_STRING ? value_to_string(library_tuple[0]) : "unknown_library";
						log_write("metacall", LOG_LEVEL_ERROR, "Failed to load dependency '%s' from loader configuration '%s.json'", dependency, plugin_name(impl->p));
						return 1;
					}
				}
			}
		}
	}

	return 0;
}